

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauDsd.c
# Opt level: O1

void Dau_DsdGenRandPerm(int *pPerm,int nVars)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  
  if (0 < nVars) {
    uVar3 = 0;
    do {
      pPerm[uVar3] = (int)uVar3;
      uVar3 = uVar3 + 1;
    } while ((uint)nVars != uVar3);
  }
  if (0 < nVars) {
    uVar3 = 0;
    do {
      iVar2 = rand();
      iVar1 = pPerm[uVar3];
      pPerm[uVar3] = pPerm[iVar2 % nVars];
      pPerm[iVar2 % nVars] = iVar1;
      uVar3 = uVar3 + 1;
    } while ((uint)nVars != uVar3);
  }
  return;
}

Assistant:

void Dau_DsdGenRandPerm( int * pPerm, int nVars )
{
    int v, vNew;
    for ( v = 0; v < nVars; v++ )
        pPerm[v] = v;
    for ( v = 0; v < nVars; v++ )
    {
        vNew = rand() % nVars;
        ABC_SWAP( int, pPerm[v], pPerm[vNew] );
    }
}